

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O3

LY_ERR schema_mount_parse(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  lysp_ext_instance *plVar1;
  int iVar2;
  lysp_module *plVar3;
  lysp_ext_instance *plVar4;
  lysp_ext_instance *plVar5;
  char *format;
  char *__s2;
  lysp_ext_instance *plVar6;
  
  plVar3 = lyplg_ext_parse_get_cur_pmod(pctx);
  if (plVar3->version == '\x02') {
    if ((ext->parent_stmt == LY_STMT_CONTAINER) || (ext->parent_stmt == LY_STMT_LIST)) {
      plVar1 = *(lysp_ext_instance **)((long)ext->parent + 0x38);
      plVar6 = (lysp_ext_instance *)0x0;
      plVar5 = plVar1;
      do {
        if (plVar1 == (lysp_ext_instance *)0x0) {
          plVar4 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar4 = plVar1[-1].exts;
        }
        if (plVar4 <= plVar6) {
          return LY_SUCCESS;
        }
        if (plVar5 != ext) {
          __s2 = ext->name;
          iVar2 = strcmp(plVar5->name,__s2);
          if (iVar2 == 0) goto LAB_0019e7d4;
        }
        plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
        plVar5 = plVar5 + 1;
      } while( true );
    }
    __s2 = ext->name;
    format = "Extension \"%s\" instance allowed only in container or list statement.";
  }
  else {
    __s2 = ext->name;
    format = "Extension \"%s\" instance not allowed in YANG version 1 module.";
  }
LAB_0019e7b9:
  lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,format,__s2);
  return LY_EINVAL;
LAB_0019e7d4:
  format = "Multiple extension \"%s\" instances.";
  goto LAB_0019e7b9;
}

Assistant:

static LY_ERR
schema_mount_parse(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    /* check YANG version 1.1 */
    if (lyplg_ext_parse_get_cur_pmod(pctx)->version != LYS_VERSION_1_1) {
        lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID, "Extension \"%s\" instance not allowed in YANG version 1 module.",
                ext->name);
        return LY_EINVAL;
    }

    /* check parent nodetype */
    if ((ext->parent_stmt != LY_STMT_CONTAINER) && (ext->parent_stmt != LY_STMT_LIST)) {
        lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID, "Extension \"%s\" instance allowed only in container or list statement.",
                ext->name);
        return LY_EINVAL;
    }

    /* check uniqueness */
    if (schema_mount_parse_unique_mp(pctx, ext)) {
        return LY_EINVAL;
    }

    /* nothing to actually parse */
    return LY_SUCCESS;
}